

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

char * cmsys::SystemTools::FindLastString(char *str1,char *str2)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  long lVar3;
  bool bVar4;
  
  if (str2 != (char *)0x0 && str1 != (char *)0x0) {
    sVar2 = strlen(str1);
    __n = strlen(str2);
    lVar3 = sVar2 - __n;
    if (__n <= sVar2) {
      do {
        iVar1 = strncmp(str1 + lVar3,str2,__n);
        if (iVar1 == 0) {
          return str1 + lVar3;
        }
        bVar4 = lVar3 != 0;
        lVar3 = lVar3 + -1;
      } while (bVar4);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* SystemTools::FindLastString(const char* str1, const char* str2)
{
  if (!str1 || !str2) {
    return NULL;
  }

  size_t len1 = strlen(str1), len2 = strlen(str2);
  if (len1 >= len2) {
    const char* ptr = str1 + len1 - len2;
    do {
      if (!strncmp(ptr, str2, len2)) {
        return ptr;
      }
    } while (ptr-- != str1);
  }

  return NULL;
}